

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O3

sx__job * sx__new_job(sx_job_context *ctx,int index,sx_job_cb *callback,void *user,int range_start,
                     int range_end,sx_job_t counter,uint32_t tags,sx_job_priority priority)

{
  int iVar1;
  code *pcVar2;
  _Bool _Var3;
  sx_fiber_t pvVar4;
  sx__job *psVar5;
  sx__pool_page *psVar6;
  char *fmt;
  uint32_t line;
  void *pvVar7;
  char *sourcefile;
  sx_fiber_stack stack;
  
  psVar6 = ctx->job_pool->pages;
  do {
    iVar1 = psVar6->iter;
    if (iVar1 != 0) {
      if (0 < iVar1) {
        psVar6->iter = iVar1 - 1U;
        psVar5 = (sx__job *)psVar6->ptrs[iVar1 - 1U];
        if (psVar5 == (sx__job *)0x0) {
          psVar5 = (sx__job *)0x0;
        }
        else {
          psVar5->job_index = index;
          psVar5->tags = tags;
          psVar5->done = 0;
          psVar5->owner_tid = 0;
          pvVar7 = (psVar5->stack_mem).sptr;
          if (pvVar7 == (void *)0x0) {
            _Var3 = sx_fiber_stack_init(&psVar5->stack_mem,ctx->stack_sz);
            if (!_Var3) {
              sourcefile = 
              "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c";
              sx__mem_run_fail_callback
                        ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                         0x81);
              fmt = "Out of memory";
              line = 0x81;
              goto LAB_0010ac38;
            }
            pvVar7 = (psVar5->stack_mem).sptr;
          }
          stack.ssize = (psVar5->stack_mem).ssize;
          stack.sptr = pvVar7;
          stack._12_4_ = 0;
          pvVar4 = sx_fiber_create(stack,fiber_fn);
          psVar5->fiber = pvVar4;
          psVar5->counter = counter;
          psVar5->wait_counter = &ctx->dummy_counter;
          psVar5->ctx = ctx;
          psVar5->callback = callback;
          psVar5->user = user;
          psVar5->range_start = range_start;
          psVar5->range_end = range_end;
          psVar5->priority = priority;
          psVar5->next = (sx__job *)0x0;
          psVar5->prev = (sx__job *)0x0;
        }
        return psVar5;
      }
      break;
    }
    psVar6 = psVar6->next;
  } while (psVar6 != (sx__pool_page *)0x0);
  sourcefile = "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h";
  fmt = "capacity is full";
  line = 0x8f;
LAB_0010ac38:
  sx__debug_message(sourcefile,line,fmt);
  pcVar2 = (code *)swi(3);
  psVar5 = (sx__job *)(*pcVar2)();
  return psVar5;
}

Assistant:

static sx__job* sx__new_job(sx_job_context* ctx, int index, sx_job_cb* callback, void* user,
                            int range_start, int range_end, sx_job_t counter, uint32_t tags,
                            sx_job_priority priority)
{
    sx__job* j = (sx__job*)sx_pool_new(ctx->job_pool);

    if (j) {
        j->job_index = index;
        j->owner_tid = 0;
        j->tags = tags;
        j->done = 0;
        if (!j->stack_mem.sptr) {
            // Initialize stack memory
            if (!sx_fiber_stack_init(&j->stack_mem, ctx->stack_sz)) {
                sx_out_of_memory();
                return NULL;
            }
        }
        j->fiber = sx_fiber_create(j->stack_mem, fiber_fn);
        j->counter = counter;
        j->wait_counter = &ctx->dummy_counter;
        j->ctx = ctx;
        j->callback = callback;
        j->user = user;
        j->range_start = range_start;
        j->range_end = range_end;
        j->priority = priority;
        j->next = j->prev = NULL;
    }
    return j;
}